

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uchar paethPredictor(short a,short b,short c)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  short pc;
  short pb;
  short pa;
  short c_local;
  short b_local;
  short a_local;
  undefined1 local_1;
  
  sVar1 = (short)((int)b - (int)c);
  if ((int)b - (int)c < 1) {
    sVar1 = -sVar1;
  }
  sVar2 = (short)((int)a - (int)c);
  if ((int)a - (int)c < 1) {
    sVar2 = -sVar2;
  }
  iVar4 = (((int)a + (int)b) - (int)c) - (int)c;
  sVar3 = (short)iVar4;
  if (iVar4 < 1) {
    sVar3 = -sVar3;
  }
  if ((sVar3 < sVar1) && (sVar3 < sVar2)) {
    local_1 = (uchar)c;
  }
  else if (sVar2 < sVar1) {
    local_1 = (uchar)b;
  }
  else {
    local_1 = (uchar)a;
  }
  return local_1;
}

Assistant:

static unsigned char paethPredictor(short a, short b, short c)
{
	short pa = abs(b - c);
	short pb = abs(a - c);
	short pc = abs(a + b - c - c);

	if (pc < pa && pc < pb) return (unsigned char)c;
	else if (pb < pa) return (unsigned char)b;
	else return (unsigned char)a;
}